

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::boolToString_abi_cxx11_(Args *this,bool b)

{
  byte in_DL;
  string *in_RDI;
  allocator local_25 [19];
  allocator local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  if (local_11 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"false",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"true",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
  }
  return in_RDI;
}

Assistant:

std::string Args::boolToString(bool b) const {
  if (b) {
    return "true";
  } else {
    return "false";
  }
}